

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_functionBytecodeAssembler_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t value;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t pointerLikeType;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  if (*(sysbvm_tuple_t *)(*arguments + 0x38) == 0) {
    value = sysbvm_functionBytecodeAssembler_addLiteral
                      (context,((sysbvm_functionBytecodeDirectCompiler_t *)arguments[1])->assembler,
                       0);
  }
  else {
    value = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                       *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sVar3 = *arguments;
  if (*(long *)(sVar3 + 0x50) == 0x1f) {
    sVar3 = sysbvm_functionBytecodeAssembler_newTemporary
                      (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                       *(sysbvm_tuple_t *)(sVar3 + 0x20));
    psVar1 = *(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10);
    pointerLikeType =
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,psVar1,*(sysbvm_tuple_t *)(*arguments + 0x20));
    sysbvm_functionBytecodeAssembler_allocaWithValue(context,psVar1,sVar3,pointerLikeType,value);
    _Var2 = sysbvm_symbolBinding_hasValidNameForDebugging
                      (context,*(sysbvm_tuple_t *)(*arguments + 0x40));
    value = sVar3;
  }
  else {
    _Var2 = sysbvm_symbolBinding_hasValidNameForDebugging(context,*(sysbvm_tuple_t *)(sVar3 + 0x40))
    ;
  }
  if (_Var2 != false) {
    psVar1 = *(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10);
    sVar3 = sysbvm_functionBytecodeAssembler_addLiteral
                      (context,psVar1,*(sysbvm_tuple_t *)(*arguments + 0x40));
    sysbvm_functionBytecodeAssembler_setDebugValue(context,psVar1,value,sVar3);
  }
  sysbvm_functionBytecodeDirectCompiler_setBindingValue
            (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
             *(sysbvm_tuple_t *)(*arguments + 0x40),value);
  return value;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astVariableDefinitionNode_t **variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t**)node;

    sysbvm_tuple_t value = (*variableDefinitionNode)->valueExpression
        ? sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*variableDefinitionNode)->valueExpression)
        : sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_NULL_TUPLE);

    bool isMutable = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMutable);
    if(isMutable)
    {
        sysbvm_tuple_t localVariable = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*variableDefinitionNode)->super.analyzedType);
        sysbvm_functionBytecodeAssembler_allocaWithValue(context, (*compiler)->assembler, localVariable,
            sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*variableDefinitionNode)->super.analyzedType),
            value);

        if(sysbvm_symbolBinding_hasValidNameForDebugging(context, (*variableDefinitionNode)->binding))
            sysbvm_functionBytecodeAssembler_setDebugValue(context, (*compiler)->assembler, localVariable,
                sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*variableDefinitionNode)->binding));

        sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, *compiler, (*variableDefinitionNode)->binding, localVariable);
        return localVariable;
    }
    else
    {
        if(sysbvm_symbolBinding_hasValidNameForDebugging(context, (*variableDefinitionNode)->binding))
            sysbvm_functionBytecodeAssembler_setDebugValue(context, (*compiler)->assembler, value,
                sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (*variableDefinitionNode)->binding));

        sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, *compiler, (*variableDefinitionNode)->binding, value);
        return value;
    }
}